

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O3

void R_DrawVoxel(FVector3 *globalpos,FAngle *viewangle,FVector3 *dasprpos,DAngle *dasprang,
                fixed_t daxscale,fixed_t dayscale,FVoxel *voxobj,lighttable_t *colormap,
                short *daumost,short *dadmost,int minslabz,int maxslabz,int flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  short sVar7;
  short sVar8;
  int stop;
  fixed_t v;
  BYTE *pBVar9;
  short *psVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  int iVar35;
  int iVar36;
  ulong uVar37;
  int iVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  int dy;
  long lVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  uint uVar47;
  int iVar48;
  int iVar49;
  uint uVar50;
  int iVar51;
  long lVar52;
  uint uVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  int iVar57;
  int iVar58;
  uint uVar59;
  byte *pbVar60;
  int iVar61;
  long lVar62;
  int iVar63;
  byte bVar64;
  int iVar65;
  int iVar66;
  uint uVar67;
  int iVar68;
  int iVar69;
  long lVar70;
  bool bVar71;
  undefined8 uStack_500;
  int aiStack_4f8 [2];
  int z1a [64];
  int z2a [64];
  int yplc [64];
  byte local_13c;
  long local_118;
  long local_f8;
  int local_c0;
  ulong local_b8;
  ulong local_b0;
  int local_70;
  int local_68;
  uint local_5c;
  int local_58;
  
  iVar20 = centerxwide;
  if (0x2ff < dayscale && 0x2ff < daxscale) {
    dVar12 = (double)centerxwide;
    dVar17 = dVar12 * 0.00625 * YaspectMul;
    fVar1 = globalpos->X;
    fVar2 = globalpos->Y;
    fVar3 = globalpos->Z;
    fVar4 = dasprpos->X;
    fVar5 = dasprpos->Y;
    fVar6 = dasprpos->Z;
    uVar25 = daxscale / 0x300;
    uVar67 = dayscale / 0x300;
    uStack_500 = 0x31856a;
    dVar13 = FFastTrig::cos(&fasttrig,
                            (double)viewangle->Degrees * 11930464.711111112 + 6755399441055744.0);
    uStack_500 = 0x3185ab;
    dVar14 = FFastTrig::sin(&fasttrig,
                            (double)viewangle->Degrees * 11930464.711111112 + 6755399441055744.0);
    uStack_500 = 0x3185ef;
    dVar15 = FFastTrig::cos(&fasttrig,dasprang->Degrees * 11930464.711111112 + 6755399441055744.0);
    uStack_500 = 0x31861e;
    dVar16 = FFastTrig::sin(&fasttrig,dasprang->Degrees * 11930464.711111112 + 6755399441055744.0);
    uStack_500 = 0x31862f;
    R_SetupDrawSlabC(colormap);
    iVar49 = SUB84((double)fVar4 + 422212465065984.0,0);
    iVar32 = SUB84((double)fVar1 + 422212465065984.0,0);
    iVar23 = iVar49 - iVar32;
    local_70 = SUB84(422212465065984.0 - (double)fVar2,0);
    iVar63 = SUB84(422212465065984.0 - (double)fVar5,0);
    iVar57 = iVar63 - local_70;
    lVar54 = (long)(SUB84((double)(float)dVar13 + 103079215104.0,0) >> 2);
    lVar42 = (long)(SUB84(103079215104.0 - (double)(float)dVar14,0) >> 2);
    uVar37 = (ulong)(iVar57 * lVar42 + iVar23 * lVar54) >> 6;
    iVar38 = (int)uVar37;
    uVar28 = (ulong)(uint)-iVar38;
    if (0 < iVar38) {
      uVar28 = uVar37 & 0xffffffff;
    }
    uVar24 = uVar67;
    if ((int)uVar25 < (int)uVar67) {
      uVar24 = uVar25;
    }
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar28 << 6;
    uVar28 = SUB168(auVar11 / ZEXT416(uVar24),0);
    iVar33 = SUB84(FocalLengthX + 824633720832.0,0);
    iVar38 = voxobj->NumMips;
    iVar65 = 0;
    if (iVar33 <= SUB164(auVar11 / ZEXT416(uVar24),0)) {
      iVar45 = 0;
      iVar44 = 0;
      if (0 < iVar38) {
        iVar45 = iVar38;
        iVar44 = 0;
      }
      do {
        iVar65 = iVar45;
        if (iVar45 == iVar44) break;
        uVar24 = (int)uVar28 >> 1;
        uVar28 = (ulong)uVar24;
        iVar44 = iVar44 + 1;
        iVar65 = iVar44;
      } while (iVar33 <= (int)uVar24);
    }
    iVar33 = iVar38 + -1;
    if (iVar65 < iVar38) {
      iVar33 = iVar65;
    }
    if (voxobj->Mips[iVar33].SlabData != (BYTE *)0x0) {
      iVar65 = SUB84(103079215104.0 - dVar16,0) >> 2;
      bVar64 = (byte)iVar33;
      uVar47 = minslabz >> (bVar64 & 0x1f);
      iVar38 = maxslabz >> (bVar64 & 0x1f);
      uVar67 = uVar67 << (bVar64 + 8 & 0x1f);
      uVar24 = -uVar67;
      if (0 < (int)uVar67) {
        uVar24 = uVar67;
      }
      uVar34 = SUB84(BaseYaspectMul + 103079215104.0,0);
      uVar53 = -uVar34;
      if (0 < (int)uVar34) {
        uVar53 = uVar34;
      }
      if (uVar24 >> 0xf < uVar53) {
        uVar24 = (uint)(((long)(int)uVar67 << 0x10) / (long)(int)uVar34);
      }
      else {
        uVar24 = 0x7fffffff - ((int)(uVar34 ^ uVar67) >> 0x1f);
      }
      lVar55 = (long)SUB84(dVar17 + 103079215104.0,0);
      iVar45 = (int)(((int)((double)(int)(uVar25 << (bVar64 + 8 & 0x1f)) / YaspectMul) * lVar55) /
                    (long)(centerxwide << 9));
      iVar68 = (int)(voxobj->Mips[iVar33].Pivot.X * 256.0);
      iVar66 = (int)(voxobj->Mips[iVar33].Pivot.Y * 256.0);
      lVar52 = (long)(int)(0x40000000 / (long)iVar45);
      lVar56 = (long)(int)((ulong)((iVar32 - iVar49) * lVar52) >> 0x10);
      lVar70 = (long)(SUB84(dVar15 + 103079215104.0,0) >> 2);
      lVar52 = (long)(int)((ulong)((local_70 - iVar63) * lVar52) >> 0x10);
      iVar44 = (int)((ulong)(lVar52 * iVar65 + lVar56 * lVar70) >> 10) + iVar68 >> 8;
      iVar63 = (int)((ulong)(-iVar65 * lVar56 + lVar52 * lVar70) >> 10) + iVar66 >> 8;
      iVar49 = voxobj->Mips[iVar33].SizeX;
      iVar32 = iVar49 + -1;
      if (iVar44 < iVar49 + -1) {
        iVar32 = iVar44;
      }
      if (iVar44 < 1) {
        iVar32 = 0;
      }
      iVar48 = voxobj->Mips[iVar33].SizeY;
      iVar61 = iVar48 + -1;
      if (iVar63 < iVar48 + -1) {
        iVar61 = iVar63;
      }
      if (iVar63 < 1) {
        iVar61 = 0;
      }
      local_c0 = SUB84(26388279066624.0 - (double)fVar6,0);
      uVar53 = SUB84(26388279066624.0 - (double)fVar3,0) - local_c0;
      uVar25 = -uVar53;
      if (0 < (int)uVar53) {
        uVar25 = uVar53;
      }
      uVar34 = -uVar24;
      if (0 < (int)uVar24) {
        uVar34 = uVar24;
      }
      if (uVar25 >> 10 < uVar34) {
        uVar28 = (ulong)((long)iVar65 * (long)iVar45) >> 0xe;
        lVar56 = (long)(int)((ulong)(lVar70 * iVar45) >> 0xe);
        lVar52 = (long)(int)(0x40000000 /
                            (long)(int)(((long)(int)((ulong)(viewingrangerecip * lVar55) >> 0x10) *
                                        (long)(int)uVar67) / (long)(centerxwide << 9)));
        uVar37 = lVar42 * lVar52;
        iVar45 = (int)((ulong)(lVar54 * lVar52) >> 0x10);
        iVar23 = iVar23 - (int)((ulong)(((long)(uVar28 * -0x100000000) >> 0x20) * (long)iVar66 +
                                       lVar56 * iVar68) >> 0x12);
        lVar42 = (long)(int)uVar28;
        iVar57 = iVar57 - (int)((ulong)(iVar68 * lVar42 + iVar66 * lVar56) >> 0x12);
        iVar65 = (int)(uVar37 >> 0x10);
        dVar13 = voxobj->Mips[iVar33].Pivot.Z;
        uVar28 = (ulong)(iVar65 * lVar42 + iVar45 * lVar56) >> 10;
        if (iVar48 < iVar49) {
          iVar48 = iVar49;
        }
        uVar25 = iVar48 + 1;
        lVar54 = -((long)(int)uVar25 * 8 + 0xfU & 0xfffffffffffffff0);
        lVar52 = lVar54 + -0x4f8;
        lVar55 = (long)(int)uVar25 * 4 + lVar52;
        uVar67 = (uint)((ulong)(((long)((uVar37 >> 0x10) * -0x100000000) >> 0x20) * lVar56 +
                               iVar45 * lVar42) >> 10);
        uVar34 = (uint)uVar28;
        if (-1 < iVar48) {
          uVar37 = 0;
          iVar49 = 0;
          iVar66 = 0;
          do {
            *(int *)((long)aiStack_4f8 + uVar37 * 4 + lVar52 + 0x4f8) = iVar49;
            iVar49 = iVar49 + uVar67;
            *(int *)((long)aiStack_4f8 + uVar37 * 4 + lVar55 + 0x4f8) = iVar66;
            iVar66 = iVar66 + uVar34;
            uVar37 = uVar37 + 1;
          } while (uVar25 != uVar37);
        }
        uVar39 = -uVar67;
        uVar25 = uVar67;
        if ((int)uVar67 < 1) {
          uVar25 = uVar39;
        }
        uVar50 = -uVar34;
        if (0 < (int)uVar34) {
          uVar50 = uVar34;
        }
        uVar25 = uVar50 + uVar25 >> 1;
        iVar49 = 0;
        uVar37 = 0;
        local_b8 = 0;
        local_5c = 0;
        local_b0 = 0;
        do {
          if ((0 < iVar32) && (iVar49 < iVar61)) {
            uVar50 = (uint)(iVar49 != iVar63);
            if (iVar49 < iVar63) {
              uVar50 = 0xffffffff;
            }
            iVar66 = (uint)(iVar44 != 0) * 3;
            if (0 < iVar44) {
              iVar66 = -3;
            }
            uVar40 = (uint)uVar37;
            switch(uVar50 + iVar66) {
            case 1:
            case 4:
              local_b8 = uVar28 & 0xffffffff;
              uVar40 = uVar67;
              break;
            case 2:
            case 3:
              local_b8 = 0;
              uVar40 = 0;
              break;
            case 0xfffffffc:
            case 0xffffffff:
              local_b8 = (ulong)uVar39;
              uVar40 = uVar34;
              break;
            case 0xfffffffd:
            case 0xfffffffe:
              local_b8 = (ulong)(uVar34 - uVar67);
              uVar40 = uVar67 + uVar34;
            }
            switch(uVar50 + iVar66) {
            case 3:
            case 4:
              local_b0 = (ulong)uVar39;
              local_5c = uVar34;
              break;
            case 0xfffffffc:
            case 0xfffffffd:
              local_b0 = uVar28 & 0xffffffff;
              local_5c = uVar67;
              break;
            case 0xfffffffe:
            case 1:
              local_b0 = 0;
              local_5c = 0;
              break;
            case 0xffffffff:
            case 2:
              local_b0 = (ulong)(uVar34 - uVar67);
              local_5c = uVar67 + uVar34;
            }
            lVar42 = (long)viewingrangerecip;
            if (iVar32 != 0) {
              bVar64 = (iVar49 < iVar63) << 2 | '\x01' << (0 < iVar44);
              local_13c = bVar64 + 4;
              lVar56 = (long)iVar49;
              iVar66 = *(int *)((long)aiStack_4f8 + lVar56 * 4 + lVar55 + 0x4f8);
              iVar68 = *(int *)((long)aiStack_4f8 + lVar56 * 4 + lVar52 + 0x4f8);
              local_f8 = 0;
              do {
                if (iVar49 != iVar61) {
                  iVar48 = voxobj->Mips[iVar33].OffsetX[local_f8];
                  pBVar9 = voxobj->Mips[iVar33].SlabData;
                  lVar70 = ((long)voxobj->Mips[iVar33].SizeY + 1) * local_f8;
                  psVar10 = voxobj->Mips[iVar33].OffsetXY;
                  iVar35 = *(int *)((long)aiStack_4f8 + local_f8 * 4 + lVar55 + 0x4f8) +
                           ((iVar23 * iVar45 + iVar57 * iVar65) - iVar68);
                  iVar46 = (int)((ulong)(((long)*(int *)((long)aiStack_4f8 +
                                                        local_f8 * 4 + lVar52 + 0x4f8) +
                                         (long)iVar66 + (long)(iVar57 * iVar45 - iVar23 * iVar65)) *
                                        (long)viewingrangerecip) >> 0x10) +
                           (int)((ulong)((int)uVar40 * lVar42) >> 0x10);
                  local_118 = lVar56;
                  do {
                    if (iVar35 < 0x3ff00000 && iVar20 * 0x834 < iVar35) {
                      sVar7 = psVar10[lVar70 + local_118];
                      sVar8 = psVar10[lVar70 + local_118 + 1];
                      if (sVar7 < sVar8) {
                        iVar26 = SUB84(((double)iVar46 * dVar12) / (double)((int)local_b8 + iVar35)
                                       + 6755399441055744.0,0) + centerx;
                        if (iVar26 < 1) {
                          iVar26 = 0;
                        }
                        iVar36 = SUB84(((double)(iVar46 + (int)((ulong)(lVar42 * (int)(local_5c -
                                                                                      uVar40)) >>
                                                               0x10)) * dVar12) /
                                       (double)((int)local_b0 + iVar35) + 6755399441055744.0,0) +
                                 centerx;
                        if (viewwidth <= iVar36) {
                          iVar36 = viewwidth;
                        }
                        if (iVar26 < iVar36) {
                          pbVar60 = pBVar9 + (long)sVar7 + (long)iVar48;
                          iVar18 = viewwidth - iVar36;
                          iVar19 = viewwidth - iVar26;
                          if ((flags & 4U) == 0) {
                            iVar18 = iVar26;
                            iVar19 = iVar36;
                          }
                          lVar29 = (long)SUB84((dVar12 * 34359738368.0) /
                                               (double)(int)(iVar35 + uVar25) + 6755399441055744.0,0
                                              );
                          lVar30 = (long)SUB84((dVar12 * 34359738368.0) /
                                               (double)(int)(iVar35 - uVar25) + 6755399441055744.0,0
                                              );
                          uVar50 = iVar19 - iVar18;
                          if (0x3f < (int)uVar50) {
                            uVar50 = 0x40;
                          }
                          do {
                            uVar59 = (uint)*pbVar60;
                            iVar26 = uVar47 - uVar59;
                            bVar71 = iVar26 == 0;
                            if (bVar71 || (int)uVar47 < (int)uVar59) {
                              iVar26 = 0;
                            }
                            uVar37 = (ulong)pbVar60[1];
                            uVar27 = (uint)*pbVar60;
                            if (!bVar71 && (int)uVar59 <= (int)uVar47) {
                              uVar27 = uVar47;
                            }
                            iVar36 = (uint)pbVar60[1] - iVar26;
                            iVar51 = iVar36 + uVar27;
                            iVar58 = iVar38 - iVar51;
                            if (iVar51 <= iVar38) {
                              iVar58 = 0;
                            }
                            uVar59 = iVar58 + iVar36;
                            if (0 < (int)uVar59) {
                              uVar27 = uVar27 * 0x8000 -
                                       ((int)(dVar13 * 256.0) * 0x80 +
                                       (int)(((long)(int)uVar53 << 0x15) /
                                            ((long)(int)uVar24 * 0xe8000000 >> 0x20)));
                              if ((int)uVar27 < 0) {
                                uVar41 = uVar59 * 0x8000 + uVar27;
                                if ((int)uVar41 < 0) {
                                  if ((pbVar60[2] & bVar64 + 0x24) != 0) {
                                    iVar36 = (int)((ulong)((int)uVar41 * lVar29) >> 0x20);
                                    goto LAB_003191b8;
                                  }
                                }
                                else if ((local_13c & pbVar60[2]) != 0) {
                                  iVar36 = (int)((ulong)uVar41 * lVar30 >> 0x20);
LAB_003191b8:
                                  iVar51 = (int)((ulong)((int)uVar27 * lVar30) >> 0x20);
                                  goto LAB_003191d6;
                                }
                              }
                              else if ((pbVar60[2] & bVar64 + 0x14) != 0) {
                                iVar51 = (int)((ulong)uVar27 * lVar29 >> 0x20);
                                iVar36 = (int)((ulong)((int)(uVar59 * 0x8000 + uVar27) * lVar30) >>
                                              0x20);
LAB_003191d6:
                                iVar51 = iVar51 + centery;
                                iVar36 = iVar36 + centery;
                                uVar27 = iVar36 - iVar51;
                                if (uVar27 != 0 && iVar51 <= iVar36) {
                                  local_68 = 0;
                                  if (uVar59 != 1) {
                                    if ((int)uVar27 < 0x400) {
                                      local_68 = (int)((int)(0xffffff / (long)(int)uVar27) * uVar59)
                                                 >> 8;
                                    }
                                    else {
                                      local_68 = 0x7fffffff;
                                      if (uVar59 >> 0xf < uVar27) {
                                        local_68 = SUB164((ZEXT416(uVar59) << 0x10) /
                                                          ZEXT416(uVar27),0);
                                      }
                                    }
                                  }
                                  if (iVar18 < iVar19) {
                                    uVar27 = uVar50;
                                    local_58 = iVar18;
                                    do {
                                      if (0 < (int)uVar27) {
                                        lVar31 = (long)local_58;
                                        uVar37 = 0;
                                        do {
                                          if (uVar59 == 1) {
                                            z2a[uVar37 + 0x3e] = 0;
                                            iVar58 = (int)daumost[lVar31 + uVar37];
                                            if (daumost[lVar31 + uVar37] < iVar51) {
                                              iVar58 = iVar51;
                                            }
                                          }
                                          else {
                                            iVar58 = (int)daumost[lVar31 + uVar37];
                                            if (iVar58 - iVar51 == 0 || iVar58 < iVar51) {
                                              z2a[uVar37 + 0x3e] = 0;
                                              iVar58 = iVar51;
                                            }
                                            else {
                                              z2a[uVar37 + 0x3e] = (iVar58 - iVar51) * local_68;
                                            }
                                          }
                                          aiStack_4f8[uVar37] = iVar58;
                                          iVar58 = (int)dadmost[uVar37 + lVar31];
                                          if (iVar36 < dadmost[uVar37 + lVar31]) {
                                            iVar58 = iVar36;
                                          }
                                          z1a[uVar37 + 0x3e] = iVar58;
                                          uVar37 = uVar37 + 1;
                                        } while (uVar37 < uVar27);
                                        if (0 < (int)uVar27) {
                                          uVar37 = 0;
                                          do {
                                            iVar69 = (int)uVar37;
                                            lVar31 = (long)iVar69;
                                            iVar58 = aiStack_4f8[lVar31];
                                            stop = z1a[lVar31 + 0x3e];
                                            dy = stop - iVar58;
                                            if (dy == 0 || stop < iVar58) {
                                              uVar37 = (ulong)(iVar69 + 1);
                                            }
                                            else {
                                              lVar21 = 0;
                                              iVar22 = 1;
                                              do {
                                                iVar43 = iVar22;
                                                lVar62 = lVar21;
                                                if (((long)(ulong)uVar27 <= lVar31 + 1 + lVar62) ||
                                                   (z1a[lVar31 + lVar62 + -1] != iVar58)) break;
                                                lVar21 = lVar62 + 1;
                                                iVar22 = iVar43 + 1;
                                              } while (z1a[lVar31 + lVar62 + 0x3f] == stop);
                                              uVar37 = uVar37 + lVar62 + 1;
                                              if ((flags & 1U) == 0) {
                                                iVar58 = ylookup[iVar58];
                                                v = z2a[lVar31 + 0x3e];
                                                *(undefined8 *)((long)&uStack_500 + lVar54) =
                                                     0x319414;
                                                R_DrawSlabC((int)lVar62 + 1,v,dy,local_68,
                                                            pbVar60 + (long)iVar26 + 3,
                                                            dc_destorg +
                                                            (iVar69 + local_58 + iVar58));
                                              }
                                              else {
                                                dc_yh = stop + -1;
                                                dc_yl = iVar58;
                                                dc_iscale = local_68;
                                                dc_count = dy;
                                                if (iVar69 <= (int)lVar62 + iVar69) {
                                                  iVar69 = iVar69 + local_58;
                                                  do {
                                                    *(undefined8 *)((long)&uStack_500 + lVar54) =
                                                         0x31948b;
                                                    FCoverageBuffer::InsertSpan
                                                              (OffscreenCoverageBuffer,iVar69,iVar58
                                                               ,stop);
                                                    if ((flags & 2U) == 0) {
                                                      *(undefined8 *)((long)&uStack_500 + lVar54) =
                                                           0x3194ba;
                                                      dc_x = iVar69;
                                                      rt_initcols(OffscreenColorBuffer +
                                                                  (long)OffscreenBufferHeight *
                                                                  ((long)iVar69 &
                                                                  0xfffffffffffffffcU));
                                                      dc_texturefrac = z2a[lVar31 + 0x3e];
                                                      *(undefined8 *)((long)&uStack_500 + lVar54) =
                                                           0x3194e2;
                                                      dc_source = pbVar60 + (long)iVar26 + 3;
                                                      (*hcolfunc_pre)();
                                                    }
                                                    iVar69 = iVar69 + 1;
                                                    iVar43 = iVar43 + -1;
                                                  } while (iVar43 != 0);
                                                  uVar37 = uVar37 & 0xffffffff;
                                                  goto LAB_00319500;
                                                }
                                              }
                                              uVar37 = uVar37 & 0xffffffff;
                                            }
LAB_00319500:
                                          } while ((int)uVar37 < (int)uVar27);
                                        }
                                      }
                                      local_58 = local_58 + 0x40;
                                      uVar27 = iVar19 - local_58;
                                      if (0x3f < (int)uVar27) {
                                        uVar27 = 0x40;
                                      }
                                    } while (local_58 < iVar19);
                                    uVar37 = (ulong)pbVar60[1];
                                  }
                                }
                              }
                            }
                            pbVar60 = pbVar60 + uVar37 + 3;
                          } while (pbVar60 < pBVar9 + (long)sVar8 + (long)iVar48);
                        }
                      }
                    }
                    local_118 = local_118 + 1;
                    iVar46 = iVar46 + (int)((ulong)((int)uVar34 * lVar42) >> 0x10);
                    iVar35 = iVar35 + uVar39;
                  } while (iVar61 != (int)local_118);
                }
                local_f8 = local_f8 + 1;
              } while (iVar32 != (int)local_f8);
            }
            uVar37 = (ulong)((int)uVar40 * lVar42) >> 0x10 & 0xffffffff;
          }
          iVar49 = iVar49 + 1;
        } while (iVar49 != 8);
      }
    }
  }
  return;
}

Assistant:

void R_DrawVoxel(const FVector3 &globalpos, FAngle viewangle,
	const FVector3 &dasprpos, DAngle dasprang,
	fixed_t daxscale, fixed_t dayscale, FVoxel *voxobj,
	lighttable_t *colormap, short *daumost, short *dadmost, int minslabz, int maxslabz, int flags)
{
	int i, j, k, x, y, syoff, ggxstart, ggystart, nxoff;
	fixed_t cosang, sinang, sprcosang, sprsinang;
	int backx, backy, gxinc, gyinc;
	int daxscalerecip, dayscalerecip, cnt, gxstart, gystart, dazscale;
	int lx, rx, nx, ny, x1=0, y1=0, x2=0, y2=0, yinc=0;
	int yoff, xs=0, ys=0, xe, ye, xi=0, yi=0, cbackx, cbacky, dagxinc, dagyinc;
	kvxslab_t *voxptr, *voxend;
	FVoxelMipLevel *mip;
	int z1a[64], z2a[64], yplc[64];

	const int nytooclose = centerxwide * 2100, nytoofar = 32768*32768 - 1048576;
	const int xdimenscale = FLOAT2FIXED(centerxwide * YaspectMul / 160);
	const double centerxwide_f = centerxwide;
	const double centerxwidebig_f = centerxwide_f * 65536*65536*8;

	// Convert to Build's coordinate system.
	fixed_t globalposx = xs_Fix<4>::ToFix(globalpos.X);
	fixed_t globalposy = xs_Fix<4>::ToFix(-globalpos.Y);
	fixed_t globalposz = xs_Fix<8>::ToFix(-globalpos.Z);

	fixed_t dasprx = xs_Fix<4>::ToFix(dasprpos.X);
	fixed_t daspry = xs_Fix<4>::ToFix(-dasprpos.Y);
	fixed_t dasprz = xs_Fix<8>::ToFix(-dasprpos.Z);

	// Shift the scales from 16 bits of fractional precision to 6.
	// Also do some magic voodoo scaling to make them the right size.
	daxscale = daxscale / (0xC000 >> 6);
	dayscale = dayscale / (0xC000 >> 6);
	if (daxscale <= 0 || dayscale <= 0)
	{
		// won't be visible.
		return;
	}

	angle_t viewang = viewangle.BAMs();
	cosang = FLOAT2FIXED(viewangle.Cos()) >> 2;
	sinang = FLOAT2FIXED(-viewangle.Sin()) >> 2;
	sprcosang = FLOAT2FIXED(dasprang.Cos()) >> 2;
	sprsinang = FLOAT2FIXED(-dasprang.Sin()) >> 2;

	R_SetupDrawSlab(colormap);

	// Select mip level
	i = abs(DMulScale6(dasprx - globalposx, cosang, daspry - globalposy, sinang));
	i = DivScale6(i, MIN(daxscale, dayscale));
	j = xs_Fix<13>::ToFix(FocalLengthX);
	for (k = 0; i >= j && k < voxobj->NumMips; ++k)
	{
		i >>= 1;
	}
	if (k >= voxobj->NumMips) k = voxobj->NumMips - 1;

	mip = &voxobj->Mips[k];		if (mip->SlabData == NULL) return;

	minslabz >>= k;
	maxslabz >>= k;

	daxscale <<= (k+8); dayscale <<= (k+8);
	dazscale = FixedDiv(dayscale, FLOAT2FIXED(BaseYaspectMul));
	daxscale = fixed_t(daxscale / YaspectMul);
	daxscale = Scale(daxscale, xdimenscale, centerxwide << 9);
	dayscale = Scale(dayscale, FixedMul(xdimenscale, viewingrangerecip), centerxwide << 9);

	daxscalerecip = (1<<30) / daxscale;
	dayscalerecip = (1<<30) / dayscale;

	fixed_t piv_x = fixed_t(mip->Pivot.X*256.);
	fixed_t piv_y = fixed_t(mip->Pivot.Y*256.);
	fixed_t piv_z = fixed_t(mip->Pivot.Z*256.);

	x = FixedMul(globalposx - dasprx, daxscalerecip);
	y = FixedMul(globalposy - daspry, daxscalerecip);
	backx = (DMulScale10(x, sprcosang, y,  sprsinang) + piv_x) >> 8;
	backy = (DMulScale10(y, sprcosang, x, -sprsinang) + piv_y) >> 8;
	cbackx = clamp(backx, 0, mip->SizeX - 1);
	cbacky = clamp(backy, 0, mip->SizeY - 1);

	sprcosang = MulScale14(daxscale, sprcosang);
	sprsinang = MulScale14(daxscale, sprsinang);

	x = (dasprx - globalposx) - DMulScale18(piv_x, sprcosang, piv_y, -sprsinang);
	y = (daspry - globalposy) - DMulScale18(piv_y, sprcosang, piv_x,  sprsinang);

	cosang = FixedMul(cosang, dayscalerecip);
	sinang = FixedMul(sinang, dayscalerecip);

	gxstart = y*cosang - x*sinang;
	gystart = x*cosang + y*sinang;
	gxinc = DMulScale10(sprsinang, cosang, sprcosang, -sinang);
	gyinc = DMulScale10(sprcosang, cosang, sprsinang,  sinang);
	if ((abs(globalposz - dasprz) >> 10) >= abs(dazscale)) return;

	x = 0; y = 0; j = MAX(mip->SizeX, mip->SizeY);
	fixed_t *ggxinc = (fixed_t *)alloca((j + 1) * sizeof(fixed_t) * 2);
	fixed_t *ggyinc = ggxinc + (j + 1);
	for (i = 0; i <= j; i++)
	{
		ggxinc[i] = x; x += gxinc;
		ggyinc[i] = y; y += gyinc;
	}

	syoff = DivScale21(globalposz - dasprz, FixedMul(dazscale, 0xE800)) + (piv_z << 7);
	yoff = (abs(gxinc) + abs(gyinc)) >> 1;

	for (cnt = 0; cnt < 8; cnt++)
	{
		switch (cnt)
		{
			case 0: xs = 0;				ys = 0;				xi =  1; yi =  1; break;
			case 1: xs = mip->SizeX-1;	ys = 0;				xi = -1; yi =  1; break;
			case 2: xs = 0;				ys = mip->SizeY-1;	xi =  1; yi = -1; break;
			case 3: xs = mip->SizeX-1;	ys = mip->SizeY-1;	xi = -1; yi = -1; break;
			case 4: xs = 0;				ys = cbacky;		xi =  1; yi =  2; break;
			case 5: xs = mip->SizeX-1;	ys = cbacky;		xi = -1; yi =  2; break;
			case 6: xs = cbackx;		ys = 0;				xi =  2; yi =  1; break;
			case 7: xs = cbackx;		ys = mip->SizeY-1;	xi =  2; yi = -1; break;
		}
		xe = cbackx; ye = cbacky;
		if (cnt < 4)
		{
			if ((xi < 0) && (xe >= xs)) continue;
			if ((xi > 0) && (xe <= xs)) continue;
			if ((yi < 0) && (ye >= ys)) continue;
			if ((yi > 0) && (ye <= ys)) continue;
		}
		else
		{
			if ((xi < 0) && (xe > xs)) continue;
			if ((xi > 0) && (xe < xs)) continue;
			if ((yi < 0) && (ye > ys)) continue;
			if ((yi > 0) && (ye < ys)) continue;
			xe += xi; ye += yi;
		}

		i = ksgn(ys-backy)+ksgn(xs-backx)*3+4;
		switch(i)
		{
			case 6: case 7: x1 = 0;				y1 = 0;				break;
			case 8: case 5: x1 = gxinc;			y1 = gyinc;			break;
			case 0: case 3: x1 = gyinc;			y1 = -gxinc;		break;
			case 2: case 1: x1 = gxinc+gyinc;	y1 = gyinc-gxinc;	break;
		}
		switch(i)
		{
			case 2: case 5: x2 = 0;				y2 = 0;				break;
			case 0: case 1: x2 = gxinc;			y2 = gyinc;			break;
			case 8: case 7: x2 = gyinc;			y2 = -gxinc;		break;
			case 6: case 3: x2 = gxinc+gyinc;	y2 = gyinc-gxinc;	break;
		}
		BYTE oand = (1 << int(xs<backx)) + (1 << (int(ys<backy)+2));
		BYTE oand16 = oand + 16;
		BYTE oand32 = oand + 32;

		if (yi > 0) { dagxinc =  gxinc; dagyinc =  FixedMul(gyinc, viewingrangerecip); }
			   else { dagxinc = -gxinc; dagyinc = -FixedMul(gyinc, viewingrangerecip); }

			/* Fix for non 90 degree viewing ranges */
		nxoff = FixedMul(x2 - x1, viewingrangerecip);
		x1 = FixedMul(x1, viewingrangerecip);

		ggxstart = gxstart + ggyinc[ys];
		ggystart = gystart - ggxinc[ys];

		for (x = xs; x != xe; x += xi)
		{
			BYTE *slabxoffs = &mip->SlabData[mip->OffsetX[x]];
			short *xyoffs = &mip->OffsetXY[x * (mip->SizeY + 1)];

			nx = FixedMul(ggxstart + ggxinc[x], viewingrangerecip) + x1;
			ny = ggystart + ggyinc[x];
			for (y = ys; y != ye; y += yi, nx += dagyinc, ny -= dagxinc)
			{
				if ((ny <= nytooclose) || (ny >= nytoofar)) continue;
				voxptr = (kvxslab_t *)(slabxoffs + xyoffs[y]);
				voxend = (kvxslab_t *)(slabxoffs + xyoffs[y+1]);
				if (voxptr >= voxend) continue;

				lx = xs_RoundToInt(nx * centerxwide_f / (ny + y1)) + centerx;
				if (lx < 0) lx = 0;
				rx = xs_RoundToInt((nx + nxoff) * centerxwide_f / (ny + y2)) + centerx;
				if (rx > viewwidth) rx = viewwidth;
				if (rx <= lx) continue;

				if (flags & DVF_MIRRORED)
				{
					int t = viewwidth - lx;
					lx = viewwidth - rx;
					rx = t;
				}

				fixed_t l1 = xs_RoundToInt(centerxwidebig_f / (ny - yoff));
				fixed_t l2 = xs_RoundToInt(centerxwidebig_f / (ny + yoff));
				for (; voxptr < voxend; voxptr = (kvxslab_t *)((BYTE *)voxptr + voxptr->zleng + 3))
				{
					const BYTE *col = voxptr->col;
					int zleng = voxptr->zleng;
					int ztop = voxptr->ztop;
					fixed_t z1, z2;

					if (ztop < minslabz)
					{
						int diff = minslabz - ztop;
						ztop = minslabz;
						col += diff;
						zleng -= diff;
					}
					if (ztop + zleng > maxslabz)
					{
						int diff = ztop + zleng - maxslabz;
						zleng -= diff;
					}
					if (zleng <= 0) continue;

					j = (ztop << 15) - syoff;
					if (j < 0)
					{
						k = j + (zleng << 15);
						if (k < 0)
						{
							if ((voxptr->backfacecull & oand32) == 0) continue;
							z2 = MulScale32(l2, k) + centery;					/* Below slab */
						}
						else
						{
							if ((voxptr->backfacecull & oand) == 0) continue;	/* Middle of slab */
							z2 = MulScale32(l1, k) + centery;
						}
						z1 = MulScale32(l1, j) + centery;
					}
					else
					{
						if ((voxptr->backfacecull & oand16) == 0) continue;
						z1 = MulScale32(l2, j) + centery;						/* Above slab */
						z2 = MulScale32(l1, j + (zleng << 15)) + centery;
					}

					if (z2 <= z1) continue;

					if (zleng == 1)
					{
						yinc = 0;
					}
					else
					{
						if (z2-z1 >= 1024) yinc = FixedDiv(zleng, z2 - z1);
						else yinc = (((1 << 24) - 1) / (z2 - z1)) * zleng >> 8;
					}
					// [RH] Clip each column separately, not just by the first one.
					for (int stripwidth = MIN<int>(countof(z1a), rx - lx), lxt = lx;
						lxt < rx;
						(lxt += countof(z1a)), stripwidth = MIN<int>(countof(z1a), rx - lxt))
					{
						// Calculate top and bottom pixels locations
						for (int xxx = 0; xxx < stripwidth; ++xxx)
						{
							if (zleng == 1)
							{
								yplc[xxx] = 0;
								z1a[xxx] = MAX<int>(z1, daumost[lxt + xxx]);
							}
							else
							{
								if (z1 < daumost[lxt + xxx])
								{
									yplc[xxx] = yinc * (daumost[lxt + xxx] - z1);
									z1a[xxx] = daumost[lxt + xxx];
								}
								else
								{
									yplc[xxx] = 0;
									z1a[xxx] = z1;
								}
							}
							z2a[xxx] = MIN<int>(z2, dadmost[lxt + xxx]);
						}
						// Find top and bottom pixels that match and draw them as one strip
						for (int xxl = 0, xxr; xxl < stripwidth; )
						{
							if (z1a[xxl] >= z2a[xxl])
							{ // No column here
								xxl++;
								continue;
							}
							int z1 = z1a[xxl];
							int z2 = z2a[xxl];
							// How many columns share the same extents?
							for (xxr = xxl + 1; xxr < stripwidth; ++xxr)
							{
								if (z1a[xxr] != z1 || z2a[xxr] != z2)
									break;
							}

							if (!(flags & DVF_OFFSCREEN))
							{
								// Draw directly to the screen.
								R_DrawSlab(xxr - xxl, yplc[xxl], z2 - z1, yinc, col, ylookup[z1] + lxt + xxl + dc_destorg);
							}
							else
							{
								// Record the area covered and possibly draw to an offscreen buffer.
								dc_yl = z1;
								dc_yh = z2 - 1;
								dc_count = z2 - z1;
								dc_iscale = yinc;
								for (int x = xxl; x < xxr; ++x)
								{
									OffscreenCoverageBuffer->InsertSpan(lxt + x, z1, z2);
									if (!(flags & DVF_SPANSONLY))
									{
										dc_x = lxt + x;
										rt_initcols(OffscreenColorBuffer + (dc_x & ~3) * OffscreenBufferHeight);
										dc_source = col;
										dc_texturefrac = yplc[xxl];
										hcolfunc_pre();
									}
								}
							}
							xxl = xxr;
						}
					}
				}
			}
		}
	}
}